

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O3

string * __thiscall
cmLocalGenerator::GetLinkLibsCMP0065
          (string *__return_storage_ptr__,cmLocalGenerator *this,string *linkLanguage,
          cmGeneratorTarget *tgt)

{
  cmMakefile *pcVar1;
  bool bVar2;
  TargetType TVar3;
  PolicyStatus PVar4;
  cmState *this_00;
  ostream *poVar5;
  PolicyID id;
  PolicyID id_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  ostringstream w;
  string local_1d0;
  string *local_1b0;
  undefined1 local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  undefined8 local_188;
  char *local_180;
  ios_base local_138 [264];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_1b0 = linkLanguage;
  TVar3 = cmGeneratorTarget::GetType(tgt);
  if (TVar3 != EXECUTABLE) {
    return __return_storage_ptr__;
  }
  this_00 = cmStateSnapshot::GetState(&(this->super_cmOutputConverter).StateSnapshot);
  local_1a8._0_8_ = &local_198;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a8,"TARGET_SUPPORTS_SHARED_LIBS","");
  bVar2 = cmState::GetGlobalPropertyAsBool(this_00,(string *)local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._0_8_ != &local_198) {
    operator_delete((void *)local_1a8._0_8_,local_198._M_allocated_capacity + 1);
  }
  if (!bVar2) {
    return __return_storage_ptr__;
  }
  PVar4 = cmPolicies::PolicyMap::Get(&tgt->PolicyMap,CMP0065);
  switch(PVar4) {
  case WARN:
    local_1a8._0_8_ = &local_198;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"ENABLE_EXPORTS","");
    bVar2 = cmGeneratorTarget::GetPropertyAsBool(tgt,(string *)local_1a8);
    if (bVar2) {
      bVar2 = false;
    }
    else {
      pcVar1 = this->Makefile;
      local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1d0,"CMAKE_POLICY_WARNING_CMP0065","");
      bVar2 = cmMakefile::PolicyOptionalWarningEnabled(pcVar1,&local_1d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._0_8_ != &local_198) {
      operator_delete((void *)local_1a8._0_8_,local_198._M_allocated_capacity + 1);
    }
    if (bVar2 != false) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1d0,(cmPolicies *)&DAT_00000041,id_00);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,local_1d0._M_dataplus._M_p,local_1d0._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,
                 "\nFor compatibility with older versions of CMake, additional flags may be added to export symbols on all executables regardless of their ENABLE_EXPORTS property."
                 ,0xa0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::stringbuf::str();
      cmake::IssueMessage(this->GlobalGenerator->CMakeInstance,AUTHOR_WARNING,&local_1d0,
                          &this->DirectoryBacktrace);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
    }
  case OLD:
    bVar2 = cmTarget::IsAIX(tgt->Target);
    if (bVar2) {
      local_1a8._0_8_ = &local_198;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"ENABLE_EXPORTS","");
      bVar2 = cmGeneratorTarget::GetPropertyAsBool(tgt,(string *)local_1a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._0_8_ != &local_198) {
        operator_delete((void *)local_1a8._0_8_,local_198._M_allocated_capacity + 1);
      }
      if (bVar2) {
        return __return_storage_ptr__;
      }
    }
    break;
  case REQUIRED_IF_USED:
  case REQUIRED_ALWAYS:
    cmPolicies::GetRequiredPolicyError_abi_cxx11_
              ((string *)local_1a8,(cmPolicies *)&DAT_00000041,id);
    cmake::IssueMessage(this->GlobalGenerator->CMakeInstance,FATAL_ERROR,(string *)local_1a8,
                        &this->DirectoryBacktrace);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._0_8_ != &local_198) {
      operator_delete((void *)local_1a8._0_8_,local_198._M_allocated_capacity + 1);
    }
  case NEW:
    bVar2 = cmTarget::IsAIX(tgt->Target);
    if (bVar2) {
      return __return_storage_ptr__;
    }
    local_1a8._0_8_ = &local_198;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"ENABLE_EXPORTS","");
    bVar2 = cmGeneratorTarget::GetPropertyAsBool(tgt,(string *)local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._0_8_ != &local_198) {
      operator_delete((void *)local_1a8._0_8_,local_198._M_allocated_capacity + 1);
    }
    if (!bVar2) {
      return __return_storage_ptr__;
    }
    break;
  default:
    goto switchD_004448b2_default;
  }
  pcVar1 = this->Makefile;
  local_198._8_8_ = (local_1b0->_M_dataplus)._M_p;
  local_198._M_allocated_capacity = local_1b0->_M_string_length;
  local_1a8._0_8_ = (pointer)0x1a;
  local_1a8._8_8_ = "CMAKE_SHARED_LIBRARY_LINK_";
  local_188 = 6;
  local_180 = "_FLAGS";
  views._M_len = 3;
  views._M_array = (iterator)local_1a8;
  cmCatViews_abi_cxx11_(&local_1d0,views);
  cmMakefile::GetSafeDefinition(pcVar1,&local_1d0);
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
switchD_004448b2_default:
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalGenerator::GetLinkLibsCMP0065(
  std::string const& linkLanguage, cmGeneratorTarget& tgt) const
{
  std::string linkFlags;

  // Flags to link an executable to shared libraries.
  if (tgt.GetType() == cmStateEnums::EXECUTABLE &&
      this->StateSnapshot.GetState()->GetGlobalPropertyAsBool(
        "TARGET_SUPPORTS_SHARED_LIBS")) {
    bool add_shlib_flags = false;
    switch (tgt.GetPolicyStatusCMP0065()) {
      case cmPolicies::WARN:
        if (!tgt.GetPropertyAsBool("ENABLE_EXPORTS") &&
            this->Makefile->PolicyOptionalWarningEnabled(
              "CMAKE_POLICY_WARNING_CMP0065")) {
          std::ostringstream w;
          /* clang-format off */
            w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0065) << "\n"
              "For compatibility with older versions of CMake, "
              "additional flags may be added to export symbols on all "
              "executables regardless of their ENABLE_EXPORTS property.";
          /* clang-format on */
          this->IssueMessage(MessageType::AUTHOR_WARNING, w.str());
        }
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        // OLD behavior is to always add the flags, except on AIX where
        // we compute symbol exports if ENABLE_EXPORTS is on.
        add_shlib_flags =
          !(tgt.Target->IsAIX() && tgt.GetPropertyAsBool("ENABLE_EXPORTS"));
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        this->IssueMessage(
          MessageType::FATAL_ERROR,
          cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0065));
        CM_FALLTHROUGH;
      case cmPolicies::NEW:
        // NEW behavior is to only add the flags if ENABLE_EXPORTS is on,
        // except on AIX where we compute symbol exports.
        add_shlib_flags =
          !tgt.Target->IsAIX() && tgt.GetPropertyAsBool("ENABLE_EXPORTS");
        break;
    }

    if (add_shlib_flags) {
      linkFlags = this->Makefile->GetSafeDefinition(
        cmStrCat("CMAKE_SHARED_LIBRARY_LINK_", linkLanguage, "_FLAGS"));
    }
  }
  return linkFlags;
}